

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O2

void duckdb::Node7Leaf::ShrinkNode15Leaf(ART *art,Node *node7_leaf,Node *node15_leaf)

{
  uint8_t i;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *pBVar1;
  Node15Leaf *pNVar2;
  ulong uVar3;
  byte bVar4;
  
  pBVar1 = BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(art,node7_leaf);
  pNVar2 = Node::Ref<duckdb::Node15Leaf>
                     (art,(Node)(node15_leaf->super_IndexPointer).data,NODE_15_LEAF);
  Node::SetGateStatus(node7_leaf,(GateStatus)((node15_leaf->super_IndexPointer).data >> 0x3f));
  bVar4 = (pNVar2->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).count;
  pBVar1->count = bVar4;
  for (uVar3 = 0; uVar3 < bVar4; uVar3 = uVar3 + 1) {
    pBVar1->key[uVar3] =
         (pNVar2->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).key[uVar3];
    bVar4 = (pNVar2->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).count;
  }
  (pNVar2->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).count = '\0';
  Node::Free(art,node15_leaf);
  return;
}

Assistant:

void Node7Leaf::ShrinkNode15Leaf(ART &art, Node &node7_leaf, Node &node15_leaf) {
	auto &n7 = New(art, node7_leaf);
	auto &n15 = Node::Ref<Node15Leaf>(art, node15_leaf, NType::NODE_15_LEAF);
	node7_leaf.SetGateStatus(node15_leaf.GetGateStatus());

	n7.count = n15.count;
	for (uint8_t i = 0; i < n15.count; i++) {
		n7.key[i] = n15.key[i];
	}

	n15.count = 0;
	Node::Free(art, node15_leaf);
}